

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.cpp
# Opt level: O0

TCHAR * CombinePathAndString(TCHAR *szPath,char *szString,size_t nLength)

{
  char *szTarget;
  TCHAR *szSubDir;
  TCHAR *szFullPath;
  size_t nLength_local;
  char *szString_local;
  TCHAR *szPath_local;
  
  szSubDir = (TCHAR *)0x0;
  szTarget = (char *)malloc(nLength + 1);
  if (szTarget != (char *)0x0) {
    CopyString(szTarget,szString,nLength);
    szSubDir = CombinePath(szPath,szTarget);
    free(szTarget);
  }
  return szSubDir;
}

Assistant:

TCHAR * CombinePathAndString(const TCHAR * szPath, const char * szString, size_t nLength)
{
    TCHAR * szFullPath = NULL;
    TCHAR * szSubDir;

    // Create the subdir string
    szSubDir = CASC_ALLOC(TCHAR, nLength + 1);
    if(szSubDir != NULL)
    {
        CopyString(szSubDir, szString, nLength);
        szFullPath = CombinePath(szPath, szSubDir);
        CASC_FREE(szSubDir);
    }

    return szFullPath;
}